

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignalsImpl::Unregister(ValidationSignalsImpl *this,CValidationInterface *callbacks)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pLVar4;
  _Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
  in_RDI;
  long in_FS_OFFSET;
  iterator it;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  Mutex *in_stack_ffffffffffffff68;
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  *in_stack_ffffffffffffff70;
  list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  *in_stack_ffffffffffffff78;
  const_iterator __position;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(int)((ulong)in_RDI._M_cur >> 0x20),
             SUB81((ulong)in_RDI._M_cur >> 0x18,0));
  std::
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  ::find(in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
  std::
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  ::end(in_stack_ffffffffffffff70);
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                      *)in_stack_ffffffffffffff78,
                     (_Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                      *)in_stack_ffffffffffffff70);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
                  *)in_stack_ffffffffffffff68);
    pLVar4 = std::_List_iterator<ValidationSignalsImpl::ListEntry>::operator->
                       ((_List_iterator<ValidationSignalsImpl::ListEntry> *)
                        in_stack_ffffffffffffff68);
    iVar3 = pLVar4->count + -1;
    pLVar4->count = iVar3;
    if (iVar3 == 0) {
      __position._M_node =
           (_List_node_base *)
           ((long)&in_RDI._M_cur[1].
                   super__Hash_node_value<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                   .
                   super__Hash_node_value_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>
                   ._M_storage._M_storage + 8);
      std::__detail::
      _Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>
                    *)in_stack_ffffffffffffff68);
      std::_List_const_iterator<ValidationSignalsImpl::ListEntry>::_List_const_iterator
                ((_List_const_iterator<ValidationSignalsImpl::ListEntry> *)in_stack_ffffffffffffff68
                 ,(iterator *)0x857f9d);
      std::__cxx11::
      list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>::
      erase(in_stack_ffffffffffffff78,__position);
    }
    std::
    unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
    ::erase(in_stack_ffffffffffffff70,(iterator)in_RDI._M_cur);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto it = m_map.find(callbacks);
        if (it != m_map.end()) {
            if (!--it->second->count) m_list.erase(it->second);
            m_map.erase(it);
        }
    }